

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  crn_thread_id_t cVar14;
  training_vec_array *this_00;
  mip_desc *pmVar15;
  ulong uVar16;
  uint *puVar17;
  byte *pbVar18;
  float *pfVar19;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar20;
  undefined8 extraout_RAX;
  void *in_RCX;
  dxt_pixel_block *in_RDX;
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  color_quad<unsigned_char,_int> *local_938;
  color_quad<unsigned_char,_int> *local_920;
  color_quad<unsigned_char,_int> *local_8f0;
  color_quad<unsigned_char,_int> *local_8d8;
  color_quad<unsigned_char,_int> *local_8b8;
  insert_result local_898;
  empty_type local_879;
  uint local_878;
  uint selectors;
  dxt1_block dxt_blk;
  uint block_index_3;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  uint cMaxEndpointClusters;
  vec6F ev_1;
  uint weight_1;
  uint cMaxWeight_1;
  uint cColorDistToWeight_1;
  uint dist_1;
  color_quad_u8 h_1;
  color_quad_u8 l_2;
  uint block_index_2;
  uint block_index_1;
  uint block_x;
  uint x_3;
  uint block_y;
  uint y_3;
  vec6F ev;
  uint weight;
  uint cMaxWeight;
  uint cColorDistToWeight;
  uint dist;
  color_quad_u8 h;
  color_quad_u8 l_1;
  uint pix_x_1;
  uint x_2;
  uint pix_y_1;
  uint y_2;
  color_quad_u8 tile_pixels [64];
  color_quad_u8 c_1 [4];
  layout_results *layout;
  uint layout_index;
  chunk_tile_desc *tile_desc;
  uint t_1;
  chunk_encoding_desc *encoding_desc;
  double dStack_678;
  float color_derating;
  double peak_snr;
  double root_mean_squared;
  double mean_squared;
  double dStack_658;
  uint t;
  double total_error;
  chunk_encoding_desc *encoding_desc_1;
  uint e;
  uint best_encoding;
  double best_peak_snr;
  long lStack_630;
  uint i;
  uint64 error;
  color_quad_u8 c [4];
  uint local_610;
  uint n_1;
  uint x_1;
  uint y_1;
  color_quad_u8 layout_pixels [64];
  uint y_ofs;
  uint x_ofs;
  uint height;
  uint width;
  uint l;
  layout_results layouts [9];
  color_quad_u8 *p;
  dxt_pixel_block *block;
  uint block_index;
  uint pix_x;
  uint x;
  uint outer_block_index;
  uint pix_y;
  uint y;
  color_quad_u8 chunk_pixels [64];
  uint local_dc;
  uint local_d8;
  uint chunk_x;
  uint chunk_y;
  float adaptive_tile_color_psnr_derating;
  uint level_height;
  uint level_width;
  uint num_chunks_y;
  uint num_chunks_x;
  mip_desc *level_desc;
  uint local_b0;
  uint level;
  uint next_progress_threshold;
  uint total_processed_blocks;
  uint encoding_hist [8];
  training_vec_array *training_vecs;
  image_u8 debug_img;
  bool debugging;
  qdxt1_params *params_local;
  dxt_pixel_block *pBlocks_local;
  uint n_local;
  qdxt1 *this_local;
  
  clear(this);
  cVar14 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar14;
  this->m_num_blocks = (uint)ctx;
  this->m_pBlocks = in_RDX;
  memcpy(&this->m_params,in_RCX,0x630);
  clusterizer<crnlib::vec<6U,_float>_>::reserve_training_vecs
            (&this->m_endpoint_clusterizer,this->m_num_blocks);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  debug_img.m_pixel_buf.m_capacity._3_1_ = 0;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&training_vecs);
  if ((((this->m_params).m_hierarchical & 1U) == 0) || ((this->m_params).m_num_mips == 0)) {
    for (h_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                        )0x0; (uint)h_1.field_0 < this->m_num_blocks;
        h_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      ((int)h_1.field_0 + 1)) {
      if ((((uint)h_1.field_0 & 0x1ff) == 0) &&
         (bVar9 = update_progress(this,(uint)h_1.field_0,this->m_num_blocks - 1), !bVar9)) {
        this_local._7_1_ = 0;
        goto LAB_00158984;
      }
      color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&dist_1);
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)&cColorDistToWeight_1);
      dxt_fast::find_representative_colors
                (0x10,(color_quad_u8 *)(this->m_pBlocks + (uint)h_1.field_0),
                 (color_quad_u8 *)&dist_1,(color_quad_u8 *)&cColorDistToWeight_1);
      uVar13 = crnlib::color::elucidian_distance
                         ((color_quad_u8 *)&dist_1,(color_quad_u8 *)&cColorDistToWeight_1,false);
      uVar10 = math::clamp<unsigned_int>(uVar13 / 5000,1,8);
      vec<6U,_float>::vec((vec<6U,_float> *)&selector_hash.m_grow_threshold);
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&dist_1,0);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,0);
      *pfVar19 = (float)bVar2;
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&dist_1,1);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,1);
      *pfVar19 = (float)bVar2;
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&dist_1,2);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,2);
      *pfVar19 = (float)bVar2;
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cColorDistToWeight_1,0);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,3);
      *pfVar19 = (float)bVar2;
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cColorDistToWeight_1,1);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,4);
      *pfVar19 = (float)bVar2;
      pbVar18 = color_quad<unsigned_char,_int>::operator[]
                          ((color_quad<unsigned_char,_int> *)&cColorDistToWeight_1,2);
      bVar2 = *pbVar18;
      pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&selector_hash.m_grow_threshold,5);
      *pfVar19 = (float)bVar2;
      clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                (&this->m_endpoint_clusterizer,(vec<6U,_float> *)&selector_hash.m_grow_threshold,
                 uVar10);
    }
  }
  else {
    this_00 = clusterizer<crnlib::vec<6U,_float>_>::get_training_vecs(&this->m_endpoint_clusterizer)
    ;
    vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::resize
              (this_00,this->m_num_blocks,false);
    utils::zero_object<unsigned_int[8]>((uint (*) [8])&next_progress_threshold);
    level = 0;
    local_b0 = 0x200;
    for (level_desc._4_4_ = 0; level_desc._4_4_ < (this->m_params).m_num_mips;
        level_desc._4_4_ = level_desc._4_4_ + 1) {
      pmVar15 = (this->m_params).m_mip_desc + level_desc._4_4_;
      uVar13 = pmVar15->m_block_width;
      uVar3 = pmVar15->m_block_height;
      uVar4 = pmVar15->m_block_width;
      uVar5 = pmVar15->m_block_height;
      chunk_x = 0x3fc00000;
      if (level_desc._4_4_ != 0) {
        fVar21 = powf(3.1,(float)level_desc._4_4_);
        chunk_x = (uint)math::maximum<float>(0.25,1.5 / fVar21);
      }
      for (local_d8 = 0; local_d8 < uVar3 + 1 >> 1; local_d8 = local_d8 + 1) {
        for (local_dc = 0; local_dc < uVar13 + 1 >> 1; local_dc = local_dc + 1) {
          local_8b8 = (color_quad<unsigned_char,_int> *)&pix_y;
          do {
            color_quad<unsigned_char,_int>::color_quad(local_8b8);
            local_8b8 = local_8b8 + 1;
          } while (local_8b8 != chunk_pixels + 0x3e);
          for (outer_block_index = 0; outer_block_index < 8;
              outer_block_index = outer_block_index + 1) {
            uVar10 = math::minimum<unsigned_int>(outer_block_index + local_d8 * 8,uVar5 * 4 - 1);
            uVar12 = pmVar15->m_first_block;
            uVar6 = pmVar15->m_block_width;
            for (block_index = 0; block_index < 8; block_index = block_index + 1) {
              uVar11 = math::minimum<unsigned_int>(block_index + local_dc * 8,uVar4 * 4 - 1);
              color_quad<unsigned_char,_int>::operator=
                        ((color_quad<unsigned_char,_int> *)
                         (&pix_y + (block_index + outer_block_index * 8)),
                         (color_quad<unsigned_char,_int> *)
                         ((long)&this->m_pBlocks[uVar12 + (uVar10 >> 2) * uVar6 + (uVar11 >> 2)].
                                 m_pixels[0][uVar11 & 3].field_0 + (ulong)((uVar10 & 3) << 4)));
            }
          }
          for (height = 0; height < 9; height = height + 1) {
            uVar10 = *(uint *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 8);
            uVar11 = *(uint *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 0xc);
            iVar7 = *(int *)(g_chunk_tile_layouts + (ulong)height * 0x14);
            iVar8 = *(int *)(g_chunk_tile_layouts + (ulong)height * 0x14 + 4);
            local_8d8 = (color_quad<unsigned_char,_int> *)&x_1;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_8d8);
              local_8d8 = local_8d8 + 1;
            } while (local_8d8 != layout_pixels + 0x3e);
            for (n_1 = 0; n_1 < uVar11; n_1 = n_1 + 1) {
              for (local_610 = 0; local_610 < uVar10; local_610 = local_610 + 1) {
                color_quad<unsigned_char,_int>::operator=
                          ((color_quad<unsigned_char,_int> *)(&x_1 + (local_610 + n_1 * uVar10)),
                           (color_quad<unsigned_char,_int> *)
                           (&pix_y + (iVar7 + local_610 + (iVar8 + n_1) * 8)));
              }
            }
            c[3].field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                           (uVar10 * uVar11);
            uVar16 = (ulong)height;
            dxt_fast::compress_color_block
                      ((uint)c[3].field_0,(color_quad_u8 *)&x_1,&width + uVar16 * 0x14,
                       (uint *)((long)&layouts[uVar16 - 1].m_error + 4),(uint8 *)(layouts + uVar16),
                       false);
            local_8f0 = (color_quad<unsigned_char,_int> *)&error;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_8f0);
              local_8f0 = local_8f0 + 1;
            } while (local_8f0 != c + 2);
            dxt1_block::get_block_colors
                      ((color_quad_u8 *)&error,(uint16)(&width)[(ulong)height * 0x14],
                       *(uint16 *)((long)&layouts[(ulong)height - 1].m_error + 4));
            lStack_630 = 0;
            for (best_peak_snr._4_4_ = 0; best_peak_snr._4_4_ < (uint)c[3].field_0;
                best_peak_snr._4_4_ = best_peak_snr._4_4_ + 1) {
              uVar12 = crnlib::color::elucidian_distance
                                 ((color_quad_u8 *)(&x_1 + best_peak_snr._4_4_),
                                  c + ((ulong)layouts[height].m_selectors
                                              [(ulong)best_peak_snr._4_4_ - 8] - 2),false);
              lStack_630 = (ulong)uVar12 + lStack_630;
            }
            *(long *)(layouts[height].m_selectors + 0x38) = lStack_630;
          }
          _e = -1.0;
          encoding_desc_1._4_4_ = 0;
          for (encoding_desc_1._0_4_ = 0; (uint)encoding_desc_1 < 8;
              encoding_desc_1._0_4_ = (uint)encoding_desc_1 + 1) {
            dStack_658 = 0.0;
            for (mean_squared._4_4_ = 0;
                mean_squared._4_4_ <
                *(uint *)(g_chunk_encodings + (ulong)(uint)encoding_desc_1 * 0x54);
                mean_squared._4_4_ = mean_squared._4_4_ + 1) {
              uVar1 = *(undefined8 *)
                       (layouts[*(uint *)((ulong)(uint)encoding_desc_1 * 0x54 + 0x26ad84 +
                                         (ulong)mean_squared._4_4_ * 0x14)].m_selectors + 0x38);
              auVar23._8_4_ = (int)((ulong)uVar1 >> 0x20);
              auVar23._0_8_ = uVar1;
              auVar23._12_4_ = 0x45300000;
              dStack_658 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
                           dStack_658;
            }
            dStack_658 = dStack_658 * 0.0052083334885537624;
            dVar22 = sqrt(dStack_658);
            dStack_678 = 999999.0;
            if ((dStack_658 != 0.0) || (NAN(dStack_658))) {
              dVar22 = log10(255.0 / dVar22);
              dStack_678 = math::clamp<double>(dVar22 * 20.0,0.0,500.0);
            }
            fVar21 = math::lerp<float,float>
                               (0.0,(float)chunk_x,
                                (float)(*(int *)(g_chunk_encodings +
                                                (ulong)(uint)encoding_desc_1 * 0x54) - 1) / 3.0);
            if (_e < dStack_678 - (double)fVar21) {
              encoding_desc_1._4_4_ = (uint)encoding_desc_1;
              _e = dStack_678 - (double)fVar21;
            }
          }
          (&next_progress_threshold)[encoding_desc_1._4_4_] =
               (&next_progress_threshold)[encoding_desc_1._4_4_] + 1;
          for (tile_desc._4_4_ = 0;
              tile_desc._4_4_ < *(uint *)(g_chunk_encodings + (ulong)encoding_desc_1._4_4_ * 0x54);
              tile_desc._4_4_ = tile_desc._4_4_ + 1) {
            puVar17 = (uint *)((ulong)encoding_desc_1._4_4_ * 0x54 + 0x26ad74 +
                              (ulong)tile_desc._4_4_ * 0x14);
            c_1._8_8_ = &width + (ulong)puVar17[4] * 0x14;
            local_920 = tile_pixels + 0x3e;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_920);
              local_920 = local_920 + 1;
            } while (local_920 != c_1 + 2);
            local_938 = (color_quad<unsigned_char,_int> *)&pix_y_1;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_938);
              local_938 = local_938 + 1;
            } while (local_938 != tile_pixels + 0x3e);
            for (x_2 = 0; x_2 < puVar17[3]; x_2 = x_2 + 1) {
              uVar10 = puVar17[1];
              for (l_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                                  )0x0;
                  (uint)l_1.field_0 <
                  ((anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)(puVar17 + 2))->
                  m_u32; l_1.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3
                                       )((int)l_1.field_0 + 1)) {
                h.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                            ((int)l_1.field_0 + *puVar17);
                color_quad<unsigned_char,_int>::operator=
                          ((color_quad<unsigned_char,_int> *)
                           (&pix_y_1 + ((int)l_1.field_0 + x_2 * puVar17[2])),
                           (color_quad<unsigned_char,_int> *)
                           (&pix_y + ((int)h.field_0 + (x_2 + uVar10) * 8)));
              }
            }
            color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&dist);
            color_quad<unsigned_char,_int>::color_quad
                      ((color_quad<unsigned_char,_int> *)&cColorDistToWeight);
            dxt_fast::find_representative_colors
                      (puVar17[2] * puVar17[3],(color_quad_u8 *)&pix_y_1,(color_quad_u8 *)&dist,
                       (color_quad_u8 *)&cColorDistToWeight);
            uVar12 = crnlib::color::elucidian_distance
                               ((color_quad_u8 *)&dist,(color_quad_u8 *)&cColorDistToWeight,false);
            ev.m_s[5] = 1.12104e-44;
            ev.m_s[4] = (float)math::clamp<unsigned_int>(uVar12 / 5000,1,8);
            vec<6U,_float>::vec((vec<6U,_float> *)&block_y);
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&dist,0);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,0);
            *pfVar19 = (float)bVar2;
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&dist,1);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,1);
            *pfVar19 = (float)bVar2;
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&dist,2);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,2);
            *pfVar19 = (float)bVar2;
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&cColorDistToWeight,0);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,3);
            *pfVar19 = (float)bVar2;
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&cColorDistToWeight,1);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,4);
            *pfVar19 = (float)bVar2;
            pbVar18 = color_quad<unsigned_char,_int>::operator[]
                                ((color_quad<unsigned_char,_int> *)&cColorDistToWeight,2);
            bVar2 = *pbVar18;
            pfVar19 = vec<6U,_float>::operator[]((vec<6U,_float> *)&block_y,5);
            *pfVar19 = (float)bVar2;
            for (x_3 = 0; x_3 < puVar17[3] >> 2; x_3 = x_3 + 1) {
              uVar10 = local_d8 * 2 + x_3 + (puVar17[1] >> 2);
              if (uVar10 < pmVar15->m_block_height) {
                for (block_index_1 = 0;
                    (block_index_1 < puVar17[2] >> 2 &&
                    (uVar11 = local_dc * 2 + block_index_1 + (*puVar17 >> 2),
                    uVar11 < pmVar15->m_block_width)); block_index_1 = block_index_1 + 1) {
                  uVar12 = pmVar15->m_first_block + uVar11 + uVar10 * pmVar15->m_block_width;
                  ppVar20 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                                      (this_00,uVar12);
                  vec<6U,_float>::operator=(&ppVar20->first,(vec<6U,_float> *)&block_y);
                  fVar21 = ev.m_s[4];
                  ppVar20 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                                      (this_00,uVar12);
                  ppVar20->second = (uint)fVar21;
                  level = level + 1;
                }
              }
            }
          }
          if (local_b0 <= level) {
            local_b0 = local_b0 + 0x200;
            bVar9 = update_progress(this,level,this->m_num_blocks - 1);
            if (!bVar9) {
              this_local._7_1_ = 0;
              goto LAB_00158984;
            }
          }
        }
      }
    }
  }
  selector_hash.m_num_valid = 0xffff;
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  bVar9 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                    (&this->m_endpoint_clusterizer,0xffff,generate_codebook_progress_callback,this,
                     false);
  if (bVar9) {
    hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)dxt_blk.m_selectors);
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    dxt_blk.m_low_color[0] = '\0';
    dxt_blk.m_low_color[1] = '\0';
    dxt_blk.m_high_color[0] = '\0';
    dxt_blk.m_high_color[1] = '\0';
    for (; (uint)dxt_blk._0_4_ < this->m_num_blocks; dxt_blk._0_4_ = dxt_blk._0_4_ + 1) {
      if (((dxt_blk._0_4_ & 0x1ff) == 0) &&
         (bVar9 = update_progress(this,dxt_blk._0_4_,this->m_num_blocks - 1), !bVar9)) {
        this_local._7_1_ = 0;
        goto LAB_00158978;
      }
      dxt_fast::compress_color_block
                ((dxt1_block *)&stack0xfffffffffffff78c,
                 (color_quad_u8 *)(this->m_pBlocks + (uint)dxt_blk._0_4_),false);
      local_878 = selectors;
      hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert(&local_898,
               (hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)dxt_blk.m_selectors,&local_878,&local_879);
    }
    uVar13 = hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
             ::size((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                     *)dxt_blk.m_selectors);
    this->m_max_selector_clusters = uVar13 + 0x80;
    update_progress(this,1,1);
    this_local._7_1_ = 1;
LAB_00158978:
    hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)dxt_blk.m_selectors);
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00158984:
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&training_vecs);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params)
    {
        clear();

        CRNLIB_ASSERT(n && pBlocks);

        m_main_thread_id = crn_get_current_thread_id();

        m_num_blocks = n;
        m_pBlocks = pBlocks;
        m_params = params;

        m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

        m_progress_start = 0;
        m_progress_range = 75;

        const bool debugging = false;
        image_u8 debug_img;

        if ((m_params.m_hierarchical) && (m_params.m_num_mips))
        {
            vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
            training_vecs.resize(m_num_blocks);

            uint encoding_hist[cNumChunkEncodings];
            utils::zero_object(encoding_hist);

            uint total_processed_blocks = 0;
            uint next_progress_threshold = 512;

            for (uint level = 0; level < m_params.m_num_mips; level++)
            {
                const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

                const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
                const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

                const uint level_width = level_desc.m_block_width * 4;
                const uint level_height = level_desc.m_block_height * 4;

                if (debugging)
                {
                    debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);
                }

                float adaptive_tile_color_psnr_derating = 1.5f; // was 2.4f
                if ((level) && (adaptive_tile_color_psnr_derating > .25f))
                {
                    adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level))); // was 3.0f
                }
                for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++)
                {
                    for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++)
                    {
                        color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

                        for (uint y = 0; y < cChunkPixelHeight; y++)
                        {
                            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

                            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

                            for (uint x = 0; x < cChunkPixelWidth; x++)
                            {
                                const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

                                const uint block_index = outer_block_index + (pix_x >> 2);

                                const dxt_pixel_block& block = m_pBlocks[block_index];

                                const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

                                chunk_pixels[x + y * 8] = p;
                            }
                        }

                        struct layout_results
                        {
                            uint m_low_color;
                            uint m_high_color;
                            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
                            uint64 m_error;
                            //float m_penalty;
                        };
                        layout_results layouts[cNumChunkTileLayouts];

                        for (uint l = 0; l < cNumChunkTileLayouts; l++)
                        {
                            const uint width = g_chunk_tile_layouts[l].m_width;
                            const uint height = g_chunk_tile_layouts[l].m_height;
                            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
                            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

                            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
                            for (uint y = 0; y < height; y++)
                            {
                                for (uint x = 0; x < width; x++)
                                {
                                    layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];
                                }
                            }

                            const uint n = width * height;
                            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

                            color_quad_u8 c[4];
                            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

                            uint64 error = 0;
                            for (uint i = 0; i < n; i++)
                            {
                                error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);
                            }

                            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
                        }

                        double best_peak_snr = -1.0f;
                        uint best_encoding = 0;

                        for (uint e = 0; e < cNumChunkEncodings; e++)
                        {
                            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

                            double total_error = 0;

                            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            {
                                total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;
                            }

                            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
                            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
                            double root_mean_squared = sqrt(mean_squared);

                            double peak_snr = 999999.0f;
                            if (mean_squared)
                            {
                                peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);
                            }

                            //if (level)
                            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

                            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
                            peak_snr = peak_snr - color_derating;

                            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

                            if (peak_snr > best_peak_snr)
                            {
                                best_peak_snr = peak_snr;
                                best_encoding = e;
                            }
                        }

                        encoding_hist[best_encoding]++;

                        const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

                        for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
                        {
                            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

                            uint layout_index = tile_desc.m_layout_index;
                            const layout_results& layout = layouts[layout_index];
                            color_quad_u8 c[4];
                            if (debugging)
                            {
                                dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));
                            }

                            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

                            for (uint y = 0; y < tile_desc.m_height; y++)
                            {
                                const uint pix_y = y + tile_desc.m_y_ofs;

                                for (uint x = 0; x < tile_desc.m_width; x++)
                                {
                                    const uint pix_x = x + tile_desc.m_x_ofs;

                                    tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                                    if (debugging)
                                    {
                                        debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
                                    }
                                }
                            }

                            color_quad_u8 l, h;
                            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

                            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                            const uint dist = color::elucidian_distance(l, h, false);

                            const uint cColorDistToWeight = 5000;
                            const uint cMaxWeight = 8;
                            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                            vec6F ev;

                            ev[0] = l[0];
                            ev[1] = l[1];
                            ev[2] = l[2];
                            ev[3] = h[0];
                            ev[4] = h[1];
                            ev[5] = h[2];

                            for (uint y = 0; y < (tile_desc.m_height >> 2); y++)
                            {
                                uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
                                if (block_y >= level_desc.m_block_height)
                                {
                                    continue;
                                }

                                for (uint x = 0; x < (tile_desc.m_width >> 2); x++)
                                {
                                    uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                                    if (block_x >= level_desc.m_block_width)
                                    {
                                        break;
                                    }

                                    uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                                    training_vecs[block_index].first = ev;
                                    training_vecs[block_index].second = weight;

                                    total_processed_blocks++;

                                    //if (debugging)
                                    //{
                                    //   debug_img(block_x, block_y) = l;
                                    //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                                    //}

                                } // x
                            } // y
                        } //t

                        if (total_processed_blocks >= next_progress_threshold)
                        {
                            next_progress_threshold += 512;

                            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
                            {
                                return false;
                            }
                        }

                    } // chunk_x
                } // chunk_y

#if GENERATE_DEBUG_IMAGES
                if (debugging)
                    image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

            } // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
        }
        else
        {
            for (uint block_index = 0; block_index < m_num_blocks; block_index++)
            {
                if ((block_index & 511) == 0)
                {
                    if (!update_progress(block_index, m_num_blocks - 1))
                    {
                        return false;
                    }
                }

                color_quad_u8 l, h;
                dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

                //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
                const uint dist = color::elucidian_distance(l, h, false);

                const uint cColorDistToWeight = 5000;
                const uint cMaxWeight = 8;
                uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

                vec6F ev;

                ev[0] = l[0];
                ev[1] = l[1];
                ev[2] = l[2];
                ev[3] = h[0];
                ev[4] = h[1];
                ev[5] = h[2];

                m_endpoint_clusterizer.add_training_vec(ev, weight);
            }
        }

        const uint cMaxEndpointClusters = 65535U;

        m_progress_start = 75;
        m_progress_range = 20;

        if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
        {
            return false;
        }

        crnlib::hash_map<uint, empty_type> selector_hash;

        m_progress_start = 95;
        m_progress_range = 5;

        for (uint block_index = 0; block_index < m_num_blocks; block_index++)
        {
            if ((block_index & 511) == 0)
            {
                if (!update_progress(block_index, m_num_blocks - 1))
                {
                    return false;
                }
            }

            dxt1_block dxt_blk;
            dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

            uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

            selector_hash.insert(selectors);
        }

        m_max_selector_clusters = selector_hash.size() + 128;

        //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
        //      trace("max selector clusters: %u\n", m_max_selector_clusters);

        update_progress(1, 1);

        return true;
    }